

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void test_fs_partial(int doread)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uv_buf_t *bufs;
  char *pcVar4;
  uv_loop_t *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  uv_buf_t *bufs_00;
  char *base;
  long lVar8;
  uint nbufs;
  uv_buf_t uVar9;
  int pipe_fds [2];
  uv_thread_t thread;
  thread_ctx_conflict ctx;
  uv_signal_t signal;
  
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
    pcVar4 = "iovs != NULL";
    uVar7 = 0xd88;
  }
  else {
    ctx.pid = pthread_self();
    ctx.size = 0xac67d;
    ctx.interval = 1000;
    ctx.doread = doread;
    ctx.data = (char *)malloc(0xac67d);
    if (ctx.data == (char *)0x0) {
      pcVar4 = "ctx.data != NULL";
      uVar7 = 0xd8f;
    }
    else {
      pcVar4 = (char *)malloc(0xac67d);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "buffer != NULL";
        uVar7 = 0xd91;
      }
      else {
        base = pcVar4;
        for (lVar8 = 8; lVar8 != 0xd4318; lVar8 = lVar8 + 0x10) {
          uVar9 = uv_buf_init(base,0xd);
          *(char **)((long)bufs + lVar8 + -8) = uVar9.base;
          *(size_t *)((long)&bufs->base + lVar8) = uVar9.len;
          base = base + 0xd;
        }
        loop = uv_default_loop();
        iVar2 = uv_signal_init(loop,&signal);
        if (iVar2 == 0) {
          iVar2 = uv_signal_start(&signal,sig_func,10);
          if (iVar2 == 0) {
            iVar2 = pipe(pipe_fds);
            if (iVar2 == 0) {
              ctx.fd = pipe_fds[(uint)doread];
              iVar2 = uv_thread_create(&thread,thread_main,&ctx);
              if (iVar2 == 0) {
                if (doread == 0) {
                  iVar2 = uv_fs_write(loop,&write_req,pipe_fds[1],bufs,0xd431,-1,(uv_fs_cb)0x0);
                  if (write_req.result != iVar2) {
                    pcVar4 = "write_req.result == result";
                    uVar7 = 0xdb6;
                    goto LAB_0012803b;
                  }
                  if (iVar2 != ctx.size) {
                    pcVar4 = "result == ctx.size";
                    uVar7 = 0xdb7;
                    goto LAB_0012803b;
                  }
                  uv_fs_req_cleanup(&write_req);
                }
                else {
                  nbufs = 0xd431;
                  iVar2 = 0;
                  bufs_00 = bufs;
                  while (iVar2 < ctx.size) {
                    uVar3 = uv_fs_read(loop,&read_req,pipe_fds[0],bufs_00,nbufs,-1,(uv_fs_cb)0x0);
                    if ((int)uVar3 < 1) {
                      if (uVar3 != 0xfffffffc) {
                        pcVar4 = "result == UV_EINTR";
                        uVar7 = 0xdaf;
                        goto LAB_0012803b;
                      }
                    }
                    else {
                      for (uVar6 = (ulong)uVar3; uVar6 != 0; uVar6 = uVar6 - uVar1) {
                        uVar1 = bufs_00->len;
                        if (uVar6 <= uVar1 && uVar1 - uVar6 != 0) {
                          bufs_00->base = bufs_00->base + uVar6;
                          bufs_00->len = uVar1 - uVar6;
                          break;
                        }
                        nbufs = nbufs - 1;
                        bufs_00 = bufs_00 + 1;
                      }
                      iVar2 = iVar2 + uVar3;
                    }
                    uv_fs_req_cleanup(&read_req);
                  }
                }
                iVar2 = bcmp(pcVar4,ctx.data,(long)ctx.size);
                if (iVar2 == 0) {
                  iVar2 = uv_thread_join(&thread);
                  if (iVar2 == 0) {
                    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
                    if (iVar2 == 0) {
                      iVar2 = close(pipe_fds[1]);
                      if (iVar2 == 0) {
                        uv_close((uv_handle_t *)&signal,(uv_close_cb)0x0);
                        iVar2 = uv_fs_read(loop,&read_req,pipe_fds[0],bufs,1,-1,(uv_fs_cb)0x0);
                        if (iVar2 == 0) {
                          uv_fs_req_cleanup(&read_req);
                          iVar2 = close(pipe_fds[0]);
                          if (iVar2 == 0) {
                            free(bufs);
                            free(pcVar4);
                            free(ctx.data);
                            puVar5 = uv_default_loop();
                            close_loop(puVar5);
                            puVar5 = uv_default_loop();
                            iVar2 = uv_loop_close(puVar5);
                            if (iVar2 == 0) {
                              return;
                            }
                            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                            uVar7 = 0xdcf;
                          }
                          else {
                            pcVar4 = "0 == close(pipe_fds[0])";
                            uVar7 = 0xdc9;
                          }
                        }
                        else {
                          pcVar4 = "result == 0";
                          uVar7 = 0xdc6;
                        }
                      }
                      else {
                        pcVar4 = "0 == close(pipe_fds[1])";
                        uVar7 = 0xdc0;
                      }
                    }
                    else {
                      pcVar4 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                      uVar7 = 0xdbe;
                    }
                  }
                  else {
                    pcVar4 = "0 == uv_thread_join(&thread)";
                    uVar7 = 0xdbd;
                  }
                }
                else {
                  pcVar4 = "0 == memcmp(buffer, ctx.data, ctx.size)";
                  uVar7 = 0xdbb;
                }
              }
              else {
                pcVar4 = "0 == uv_thread_create(&thread, thread_main, &ctx)";
                uVar7 = 0xd9e;
              }
            }
            else {
              pcVar4 = "0 == pipe(pipe_fds)";
              uVar7 = 0xd9b;
            }
          }
          else {
            pcVar4 = "0 == uv_signal_start(&signal, sig_func, SIGUSR1)";
            uVar7 = 0xd99;
          }
        }
        else {
          pcVar4 = "0 == uv_signal_init(loop, &signal)";
          uVar7 = 0xd98;
        }
      }
    }
  }
LAB_0012803b:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar7,pcVar4);
  abort();
}

Assistant:

static void test_fs_partial(int doread) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int pipe_fds[2];
  size_t iovcount;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;

  iovcount = 54321;

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT(iovs != NULL);

  ctx.pid = pthread_self();
  ctx.doread = doread;
  ctx.interval = 1000;
  ctx.size = sizeof(test_buf) * iovcount;
  ctx.data = malloc(ctx.size);
  ASSERT(ctx.data != NULL);
  buffer = malloc(ctx.size);
  ASSERT(buffer != NULL);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf), sizeof(test_buf));

  loop = uv_default_loop();

  ASSERT(0 == uv_signal_init(loop, &signal));
  ASSERT(0 == uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT(0 == pipe(pipe_fds));

  ctx.fd = pipe_fds[doread];
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));

  if (doread) {
    uv_buf_t* read_iovs;
    int nread;
    read_iovs = iovs;
    nread = 0;
    while (nread < ctx.size) {
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], read_iovs, iovcount, -1, NULL);
      if (result > 0) {
        size_t read_iovcount;
        read_iovcount = uv_test_fs_buf_offset(read_iovs, result);
        read_iovs += read_iovcount;
        iovcount -= read_iovcount;
        nread += result;
      } else {
        ASSERT(result == UV_EINTR);
      }
      uv_fs_req_cleanup(&read_req);
    }
  } else {
    int result;
    result = uv_fs_write(loop, &write_req, pipe_fds[1], iovs, iovcount, -1, NULL);
    ASSERT(write_req.result == result);
    ASSERT(result == ctx.size);
    uv_fs_req_cleanup(&write_req);
  }

  ASSERT(0 == memcmp(buffer, ctx.data, ctx.size));

  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(0 == close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  { /* Make sure we read everything that we wrote. */
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], iovs, 1, -1, NULL);
      ASSERT(result == 0);
      uv_fs_req_cleanup(&read_req);
  }
  ASSERT(0 == close(pipe_fds[0]));

  free(iovs);
  free(buffer);
  free(ctx.data);

  MAKE_VALGRIND_HAPPY();
}